

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
SQLite::Database::Database
          (Database *this,char *apFilename,int aFlags,int aBusyTimeoutMs,char *apVfs)

{
  char *pcVar1;
  int ret_00;
  Exception *this_00;
  pointer psStack_48;
  int ret;
  sqlite3 *handle;
  allocator local_29;
  char *local_28;
  char *apVfs_local;
  int aBusyTimeoutMs_local;
  int aFlags_local;
  char *apFilename_local;
  Database *this_local;
  
  local_28 = apVfs;
  apVfs_local._0_4_ = aBusyTimeoutMs;
  apVfs_local._4_4_ = aFlags;
  _aBusyTimeoutMs_local = apFilename;
  apFilename_local = (char *)this;
  std::unique_ptr<sqlite3,SQLite::Database::Deleter>::unique_ptr<SQLite::Database::Deleter,void>
            ((unique_ptr<sqlite3,SQLite::Database::Deleter> *)this);
  pcVar1 = _aBusyTimeoutMs_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mFilename,pcVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ret_00 = sqlite3_open_v2(_aBusyTimeoutMs_local,&stack0xffffffffffffffb8,apVfs_local._4_4_,local_28
                          );
  std::unique_ptr<sqlite3,_SQLite::Database::Deleter>::reset(&this->mSQLitePtr,psStack_48);
  if (ret_00 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,psStack_48,ret_00);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (0 < (int)apVfs_local) {
    setBusyTimeout(this,(int)apVfs_local);
  }
  return;
}

Assistant:

Database::Database(const char* apFilename,
                   const int   aFlags         /* = SQLite::OPEN_READONLY*/,
                   const int   aBusyTimeoutMs /* = 0 */,
                   const char* apVfs          /* = nullptr*/) :
    mFilename(apFilename)
{
    sqlite3* handle;
    const int ret = sqlite3_open_v2(apFilename, &handle, aFlags, apVfs);
    mSQLitePtr.reset(handle);
    if (SQLITE_OK != ret)
    {
        throw SQLite::Exception(handle, ret);
    }
    if (aBusyTimeoutMs > 0)
    {
        setBusyTimeout(aBusyTimeoutMs);
    }
}